

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  int i;
  int iVar1;
  int k;
  int n;
  list<int> l;
  int x;
  int local_40;
  int local_3c;
  list<int> local_38;
  int local_24;
  
  std::ios_base::sync_with_stdio(false);
  *(undefined8 *)(*(long *)(std::cin + -0x18) + 0x105188) = 0;
  CP::list<int>::list(&local_38);
  std::istream::operator>>((istream *)&std::cin,&local_3c);
  for (iVar1 = 0; iVar1 < local_3c; iVar1 = iVar1 + 1) {
    std::istream::operator>>((istream *)&std::cin,&local_24);
    CP::list<int>::push_back(&local_38,&local_24);
  }
  std::istream::operator>>((istream *)&std::cin,&local_40);
  for (iVar1 = 0; iVar1 < local_40; iVar1 = iVar1 + 1) {
    CP::list<int>::shift_left(&local_38);
    CP::list<int>::check_pointer(&local_38);
    CP::list<int>::print(&local_38);
  }
  CP::list<int>::~list(&local_38);
  return 0;
}

Assistant:

int main() {
  std::ios_base::sync_with_stdio(false);std::cin.tie(NULL);

  CP::list<int> l;
  int n,k;
  std::cin >> n;
  for (int i = 0;i < n;i++) {
    int x;
    std::cin >> x;
    l.push_back(x);
  }

  std::cin >> k;
  for (int i = 0;i < k;i++) {
    l.shift_left();
    l.check_pointer();
    l.print();
  }


}